

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

kp_error_t kp_cfg_load(kp_ctx *ctx,char *sub)

{
  int iVar1;
  kp_error_t kVar2;
  int *piVar3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  char *save_line;
  kp_safe cfg_safe;
  char path [4096];
  char *local_2058;
  kp_safe local_2050;
  char local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_1038,0,0x1000);
  local_2058 = (char *)0x0;
  pcVar6 = "/";
  if (*sub == '\0') {
    pcVar6 = "";
  }
  iVar1 = __snprintf_chk(local_1038,0x1000,1,0x1000,"%s%s.config",sub,pcVar6);
  if (iVar1 < 0x1000) {
    kVar2 = kp_safe_init(ctx,&local_2050,local_1038);
    if (kVar2 == 0) {
      kVar2 = kp_safe_open(ctx,&local_2050,0);
      if (kVar2 == 0) {
        if ((ctx->agent).connected == true) {
          kVar2 = kp_safe_store(ctx,&local_2050,0xe10);
          if (kVar2 != 0) goto LAB_00103a7c;
        }
        qsort(configs,2,0x20,config_sort);
        pcVar6 = strtok_r(local_2050.metadata,"\n",&local_2058);
        if (pcVar6 != (char *)0x0) {
          do {
            pcVar6 = strtok(pcVar6,":");
            pcVar4 = strtok((char *)0x0,":");
            pvVar5 = bsearch(pcVar6,configs,2,0x20,config_search);
            if (pvVar5 != (void *)0x0) {
              (**(code **)((long)pvVar5 + 0x18))(pvVar5,ctx,pcVar4);
            }
            pcVar6 = strtok_r((char *)0x0,"\n",&local_2058);
          } while (pcVar6 != (char *)0x0);
        }
        kVar2 = kp_safe_close(ctx,&local_2050);
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x24;
    kVar2 = 5;
  }
LAB_00103a7c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return kVar2;
  }
  __stack_chk_fail();
}

Assistant:

kp_error_t
kp_cfg_load(struct kp_ctx *ctx, const char *sub)
{
	kp_error_t ret;
	char path[PATH_MAX] = "";
	struct kp_safe cfg_safe;
	char *line = NULL, *save_line = NULL;

	if (snprintf(path, PATH_MAX, "%s%s" KP_CONFIG_SAFE_NAME,
	    sub, strlen(sub) == 0 ? "": "/") >= PATH_MAX) {
		errno = ENAMETOOLONG;
		return KP_ERRNO;
	}

	if ((ret = kp_safe_init(ctx, &cfg_safe, path)) != KP_SUCCESS) {
		return ret;
	}

	if ((ret = kp_safe_open(ctx, &cfg_safe, 0)) != KP_SUCCESS) {
		return ret;
	}

	if (ctx->agent.connected) {
		if ((ret = kp_safe_store(ctx, &cfg_safe, 3600)) != KP_SUCCESS) {
			return ret;
		}
	}

	qsort(configs, N_CONFIG, sizeof(struct config), config_sort);

	line = strtok_r(cfg_safe.metadata, "\n", &save_line);
	while (line != NULL) {
		struct config *config;
		char *key, *value;

		key = strtok(line, ":");
		value = strtok(NULL, ":");

		config = bsearch(key, configs, N_CONFIG, sizeof(struct config), config_search);
		if (config != NULL) {
			config->setter(config, ctx, value);
		}

		line = strtok_r(NULL, "\n", &save_line);
	}

	if ((ret = kp_safe_close(ctx, &cfg_safe)) != KP_SUCCESS) {
		return ret;
	}

	return KP_SUCCESS;
}